

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalWatcomWMakeGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalWatcomWMakeGenerator::EnableLanguage
          (cmGlobalWatcomWMakeGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *l,cmMakefile *mf,bool optional)

{
  allocator local_41;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,"WATCOM",&local_41);
  cmMakefile::AddDefinition(mf,&local_40,"1");
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)&local_40,"CMAKE_QUOTE_INCLUDE_PATHS",&local_41);
  cmMakefile::AddDefinition(mf,&local_40,"1");
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)&local_40,"CMAKE_MANGLE_OBJECT_FILE_NAMES",&local_41);
  cmMakefile::AddDefinition(mf,&local_40,"1");
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)&local_40,"CMAKE_MAKE_LINE_CONTINUE",&local_41);
  cmMakefile::AddDefinition(mf,&local_40,"&");
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)&local_40,"CMAKE_MAKE_SYMBOLIC_RULE",&local_41);
  cmMakefile::AddDefinition(mf,&local_40,".SYMBOLIC");
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)&local_40,"CMAKE_GENERATOR_CC",&local_41);
  cmMakefile::AddDefinition(mf,&local_40,"wcl386");
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)&local_40,"CMAKE_GENERATOR_CXX",&local_41);
  cmMakefile::AddDefinition(mf,&local_40,"wcl386");
  std::__cxx11::string::~string((string *)&local_40);
  cmGlobalUnixMakefileGenerator3::EnableLanguage
            (&this->super_cmGlobalUnixMakefileGenerator3,l,mf,optional);
  return;
}

Assistant:

void cmGlobalWatcomWMakeGenerator
::EnableLanguage(std::vector<std::string>const& l,
                 cmMakefile *mf,
                 bool optional)
{
  // pick a default
  mf->AddDefinition("WATCOM", "1");
  mf->AddDefinition("CMAKE_QUOTE_INCLUDE_PATHS", "1");
  mf->AddDefinition("CMAKE_MANGLE_OBJECT_FILE_NAMES", "1");
  mf->AddDefinition("CMAKE_MAKE_LINE_CONTINUE", "&");
  mf->AddDefinition("CMAKE_MAKE_SYMBOLIC_RULE", ".SYMBOLIC");
  mf->AddDefinition("CMAKE_GENERATOR_CC", "wcl386");
  mf->AddDefinition("CMAKE_GENERATOR_CXX", "wcl386");
  this->cmGlobalUnixMakefileGenerator3::EnableLanguage(l, mf, optional);
}